

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Environment.cpp
# Opt level: O2

ptr<Function> __thiscall Environment::getFunction(Environment *this,Identifier *ident)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ptr<Function> pVar1;
  
  getMember((Environment *)&stack0xffffffffffffffe0,ident);
  std::dynamic_pointer_cast<Function,Member>((shared_ptr<Member> *)this);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffe8);
  pVar1.super___shared_ptr<Function,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  pVar1.super___shared_ptr<Function,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ptr<Function>)pVar1.super___shared_ptr<Function,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<Function> Environment::getFunction(const Identifier &ident) {
    return std::dynamic_pointer_cast<Function>(getMember(ident));
}